

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

NODE * condition_node(NODE *lhsRelattr,CompOp op,NODE *rhsRelattrOrValue)

{
  NODE *pNVar1;
  NODE *n;
  NODE *rhsRelattrOrValue_local;
  CompOp op_local;
  NODE *lhsRelattr_local;
  
  pNVar1 = newnode(N_CONDITION);
  (pNVar1->u).QUERY.relattrlist = lhsRelattr;
  (pNVar1->u).CONDITION.op = op;
  (pNVar1->u).QUERY.conditionlist = (node *)(rhsRelattrOrValue->u).CREATETABLE.relname;
  (pNVar1->u).UPDATE.conditionlist = (rhsRelattrOrValue->u).CREATETABLE.attrlist;
  return pNVar1;
}

Assistant:

NODE *condition_node(NODE *lhsRelattr, CompOp op, NODE *rhsRelattrOrValue)
{
    NODE *n = newnode(N_CONDITION);

    n->u.CONDITION.lhsRelattr = lhsRelattr;
    n->u.CONDITION.op = op;
    n->u.CONDITION.rhsRelattr = 
      rhsRelattrOrValue->u.RELATTR_OR_VALUE.relattr;
    n->u.CONDITION.rhsValue = 
      rhsRelattrOrValue->u.RELATTR_OR_VALUE.value;
    return n;
}